

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_connection.c
# Opt level: O3

int amqp_send_frame(amqp_connection_state_t state,amqp_frame_t *frame)

{
  ushort uVar1;
  uint8_t *buf;
  ulong uVar2;
  uint8_t res;
  int iVar3;
  ssize_t sVar4;
  uint64_t uVar5;
  uint uVar6;
  amqp_bytes_t encoded;
  amqp_bytes_t encoded_00;
  uint8_t frame_end_byte;
  iovec iov [3];
  undefined1 local_49;
  iovec local_48;
  void *local_38;
  size_t local_30;
  undefined1 *local_28;
  undefined8 local_20;
  
  buf = (uint8_t *)(state->outbound_buffer).bytes;
  *buf = frame->frame_type;
  *(amqp_channel_t *)(buf + 1) = frame->channel << 8 | frame->channel >> 8;
  iVar3 = -10;
  switch(frame->frame_type) {
  case '\x01':
    uVar6 = (frame->payload).method.id;
    *(uint *)(buf + 7) =
         uVar6 >> 0x18 | (uVar6 & 0xff0000) >> 8 | (uVar6 & 0xff00) << 8 | uVar6 << 0x18;
    encoded.len = (state->outbound_buffer).len - 0xc;
    encoded.bytes = buf + 0xb;
    iVar3 = amqp_encode_method((frame->payload).method.id,(frame->payload).method.decoded,encoded);
    if (iVar3 < 0) {
      return iVar3;
    }
    uVar6 = iVar3 + 4;
    break;
  case '\x02':
    uVar1 = (frame->payload).properties.class_id;
    *(ushort *)(buf + 7) = uVar1 << 8 | uVar1 >> 8;
    buf[9] = '\0';
    buf[10] = '\0';
    uVar2 = (frame->payload).properties.body_size;
    *(ulong *)(buf + 0xb) =
         uVar2 >> 0x38 | (uVar2 & 0xff000000000000) >> 0x28 | (uVar2 & 0xff0000000000) >> 0x18 |
         (uVar2 & 0xff00000000) >> 8 | (uVar2 & 0xff000000) << 8 | (uVar2 & 0xff0000) << 0x18 |
         (uVar2 & 0xff00) << 0x28 | uVar2 << 0x38;
    encoded_00.len = (state->outbound_buffer).len - 0x14;
    encoded_00.bytes = buf + 0x13;
    iVar3 = amqp_encode_properties
                      ((frame->payload).properties.class_id,(frame->payload).properties.decoded,
                       encoded_00);
    if (iVar3 < 0) {
      return iVar3;
    }
    uVar6 = iVar3 + 0xc;
    break;
  case '\x03':
    local_28 = &local_49;
    local_49 = 0xce;
    uVar6 = (frame->payload).method.id;
    *(uint *)(buf + 3) =
         uVar6 >> 0x18 | (uVar6 & 0xff0000) >> 8 | (uVar6 & 0xff00) << 8 | uVar6 << 0x18;
    local_48.iov_len = 7;
    local_38 = (frame->payload).method.decoded;
    local_30 = (frame->payload).body_fragment.len;
    local_20 = 1;
    local_48.iov_base = buf;
    sVar4 = amqp_socket_writev(state->socket,&local_48,3);
    iVar3 = (int)sVar4;
    goto LAB_001094f4;
  default:
    goto switchD_001093f9_caseD_4;
  case '\b':
    uVar6 = 0;
  }
  *(uint *)(buf + 3) =
       uVar6 >> 0x18 | (uVar6 & 0xff0000) >> 8 | (uVar6 & 0xff00) << 8 | uVar6 << 0x18;
  buf[(ulong)uVar6 + 7] = 0xce;
  sVar4 = amqp_socket_send(state->socket,buf,(ulong)uVar6 + 8);
  iVar3 = (int)sVar4;
LAB_001094f4:
  if (0 < state->heartbeat) {
    uVar5 = amqp_get_monotonic_timestamp();
    if (uVar5 == 0) {
      iVar3 = -0xe;
    }
    else {
      state->next_send_heartbeat = (long)state->heartbeat * 1000000000 + uVar5;
    }
  }
switchD_001093f9_caseD_4:
  return iVar3;
}

Assistant:

int amqp_send_frame(amqp_connection_state_t state,
                    const amqp_frame_t *frame)
{
  void *out_frame = state->outbound_buffer.bytes;
  int res;

  amqp_e8(out_frame, 0, frame->frame_type);
  amqp_e16(out_frame, 1, frame->channel);

  if (frame->frame_type == AMQP_FRAME_BODY) {
    /* For a body frame, rather than copying data around, we use
       writev to compose the frame */
    struct iovec iov[3];
    uint8_t frame_end_byte = AMQP_FRAME_END;
    const amqp_bytes_t *body = &frame->payload.body_fragment;

    amqp_e32(out_frame, 3, body->len);

    iov[0].iov_base = out_frame;
    iov[0].iov_len = HEADER_SIZE;
    iov[1].iov_base = body->bytes;
    iov[1].iov_len = body->len;
    iov[2].iov_base = &frame_end_byte;
    iov[2].iov_len = FOOTER_SIZE;

    res = amqp_socket_writev(state->socket, iov, 3);
  } else {
    size_t out_frame_len;
    amqp_bytes_t encoded;

    switch (frame->frame_type) {
    case AMQP_FRAME_METHOD:
      amqp_e32(out_frame, HEADER_SIZE, frame->payload.method.id);

      encoded.bytes = amqp_offset(out_frame, HEADER_SIZE + 4);
      encoded.len = state->outbound_buffer.len - HEADER_SIZE - 4 - FOOTER_SIZE;

      res = amqp_encode_method(frame->payload.method.id,
                               frame->payload.method.decoded, encoded);
      if (res < 0) {
        return res;
      }

      out_frame_len = res + 4;
      break;

    case AMQP_FRAME_HEADER:
      amqp_e16(out_frame, HEADER_SIZE, frame->payload.properties.class_id);
      amqp_e16(out_frame, HEADER_SIZE+2, 0); /* "weight" */
      amqp_e64(out_frame, HEADER_SIZE+4, frame->payload.properties.body_size);

      encoded.bytes = amqp_offset(out_frame, HEADER_SIZE + 12);
      encoded.len = state->outbound_buffer.len - HEADER_SIZE - 12 - FOOTER_SIZE;

      res = amqp_encode_properties(frame->payload.properties.class_id,
                                   frame->payload.properties.decoded, encoded);
      if (res < 0) {
        return res;
      }

      out_frame_len = res + 12;
      break;

    case AMQP_FRAME_HEARTBEAT:
      out_frame_len = 0;
      break;

    default:
      return AMQP_STATUS_INVALID_PARAMETER;
    }

    amqp_e32(out_frame, 3, out_frame_len);
    amqp_e8(out_frame, out_frame_len + HEADER_SIZE, AMQP_FRAME_END);
    res = amqp_socket_send(state->socket, out_frame,
                           out_frame_len + HEADER_SIZE + FOOTER_SIZE);
  }

  if (state->heartbeat > 0) {
    uint64_t current_time = amqp_get_monotonic_timestamp();
    if (0 == current_time) {
      return AMQP_STATUS_TIMER_FAILURE;
    }
    state->next_send_heartbeat = amqp_calc_next_send_heartbeat(state, current_time);
  }

  return res;
}